

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O0

void tabread4_float(t_tabread4 *x,t_float f)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  t_word *wp;
  float frac;
  float cminusb;
  float d;
  float c;
  float b;
  float a_1;
  int n;
  t_word *vec;
  _garray *p_Stack_20;
  int npoints;
  _garray *a;
  t_tabread4 *ptStack_10;
  t_float f_local;
  t_tabread4 *x_local;
  
  a._4_4_ = f;
  ptStack_10 = x;
  p_Stack_20 = (_garray *)pd_findbyclass(x->x_arrayname,garray_class);
  if (p_Stack_20 == (_garray *)0x0) {
    pd_error(ptStack_10,"%s: no such array",ptStack_10->x_arrayname->s_name);
  }
  else {
    iVar3 = garray_getfloatwords(p_Stack_20,(int *)((long)&vec + 4),(t_word **)&a_1);
    if (iVar3 == 0) {
      pd_error(ptStack_10,"%s: bad template for tabread4",ptStack_10->x_arrayname->s_name);
    }
    else if (vec._4_4_ < 4) {
      outlet_float((ptStack_10->x_obj).te_outlet,0.0);
    }
    else if (1.0 < a._4_4_) {
      if (a._4_4_ < (float)(vec._4_4_ + -2)) {
        b = (float)(int)a._4_4_;
        if (vec._4_4_ + -2 <= (int)b) {
          b = (float)(vec._4_4_ + -3);
        }
        _a_1 = _a_1 + (int)b;
        fVar4 = a._4_4_ - (float)(int)b;
        fVar1 = _a_1[-1].w_float;
        fVar2 = _a_1->w_float;
        outlet_float((ptStack_10->x_obj).te_outlet,
                     fVar4 * (-((1.0 - fVar4) * 0.1666667) *
                              (((_a_1[1].w_float - fVar2) * -3.0 + (_a_1[2].w_float - fVar1)) *
                               fVar4 + fVar2 * -3.0 + fVar1 + fVar1 + _a_1[2].w_float) +
                             (_a_1[1].w_float - fVar2)) + fVar2);
      }
      else {
        outlet_float((ptStack_10->x_obj).te_outlet,_a_1[vec._4_4_ + -2].w_float);
      }
    }
    else {
      outlet_float((ptStack_10->x_obj).te_outlet,_a_1[1].w_float);
    }
  }
  return;
}

Assistant:

static void tabread4_float(t_tabread4 *x, t_float f)
{
    t_garray *a;
    int npoints;
    t_word *vec;

    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
        pd_error(x, "%s: no such array", x->x_arrayname->s_name);
    else if (!garray_getfloatwords(a, &npoints, &vec))
        pd_error(x, "%s: bad template for tabread4", x->x_arrayname->s_name);
    else if (npoints < 4)
        outlet_float(x->x_obj.ob_outlet, 0);
    else if (f <= 1)
        outlet_float(x->x_obj.ob_outlet, vec[1].w_float);
    else if (f >= npoints - 2)
        outlet_float(x->x_obj.ob_outlet, vec[npoints - 2].w_float);
    else
    {
        int n = f;
        float a, b, c, d, cminusb, frac;
        t_word *wp;
        if (n >= npoints - 2)
            n = npoints - 3;
        wp = vec + n;
        frac = f - n;
        a = wp[-1].w_float;
        b = wp[0].w_float;
        c = wp[1].w_float;
        d = wp[2].w_float;
        cminusb = c-b;
        outlet_float(x->x_obj.ob_outlet, b + frac * (
            cminusb - 0.1666667f * (1.-frac) * (
                (d - a - 3.0f * cminusb) * frac + (d + 2.0f*a - 3.0f*b))));
    }
}